

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpropertyanimation.cpp
# Opt level: O3

void QPropertyAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Data *pDVar1;
  char *pcVar2;
  long lVar3;
  QArrayData *data;
  parameter_type pQVar4;
  QBindableInterface *pQVar5;
  parameter_type pQVar6;
  long *plVar7;
  
  if (_c == BindableProperty) {
    if (_id == 1) {
      plVar7 = (long *)*_a;
      *plVar7 = (long)&(_o->d_ptr).d[4].children.d.ptr;
      pQVar5 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>,_void>
                ::iface;
    }
    else {
      if (_id != 0) {
        return;
      }
      plVar7 = (long *)*_a;
      *plVar7 = (long)&(_o->d_ptr).d[4].field_0x30;
      pQVar5 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>,_void>
                ::iface;
    }
    plVar7[1] = (long)pQVar5;
  }
  else if (_c == WriteProperty) {
    if (_id == 1) {
      setTargetObject((QPropertyAnimation *)_o,(QObject *)(((QByteArray *)*_a)->d).d);
      return;
    }
    if (_id == 0) {
      setPropertyName((QPropertyAnimation *)_o,(QByteArray *)*_a);
      return;
    }
  }
  else if (_c == ReadProperty) {
    plVar7 = (long *)*_a;
    if (_id == 1) {
      pQVar6 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
               ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                        *)&(_o->d_ptr).d[4].children.d.ptr);
      *plVar7 = (long)pQVar6;
    }
    else if (_id == 0) {
      pQVar4 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                        *)&(_o->d_ptr).d[4].field_0x30);
      pDVar1 = (pQVar4->d).d;
      pcVar2 = (pQVar4->d).ptr;
      lVar3 = (pQVar4->d).size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      data = (QArrayData *)*plVar7;
      *plVar7 = (long)pDVar1;
      plVar7[1] = (long)pcVar2;
      plVar7[2] = lVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void QPropertyAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPropertyAnimation *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QByteArray*>(_v) = _t->propertyName(); break;
        case 1: *reinterpret_cast<QObject**>(_v) = _t->targetObject(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPropertyName(*reinterpret_cast<QByteArray*>(_v)); break;
        case 1: _t->setTargetObject(*reinterpret_cast<QObject**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindablePropertyName(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTargetObject(); break;
        default: break;
        }
    }
}